

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# celu.c
# Opt level: O3

rt_function_error_t exec_celu(rt_function_t *f)

{
  long *plVar1;
  long *plVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  long local_88;
  long local_78;
  long local_70;
  
  plVar1 = (long *)f->local_context;
  plVar2 = (long *)*plVar1;
  lVar5 = (long)*(int *)((long)plVar1 + 0xc);
  uVar8 = 1;
  if (*(int *)((long)plVar1 + 0xc) < (int)plVar2[6]) {
    do {
      uVar8 = uVar8 * *(int *)(plVar2[7] + lVar5 * 4);
      lVar5 = lVar5 + 1;
    } while ((int)plVar2[6] != lVar5);
  }
  uVar4 = (long)(int)plVar2[2] / (long)(int)uVar8;
  if (0 < (int)uVar4) {
    uVar9 = (ulong)uVar8;
    local_70 = (long)(int)uVar8 << 2;
    local_88 = 0;
    local_78 = 0;
    uVar6 = 0;
    do {
      if (0 < (int)uVar8) {
        lVar5 = *(long *)(plVar2[3] + 0x18);
        lVar3 = *(long *)(*plVar2 + 0x18);
        uVar7 = 0;
        do {
          fVar12 = *(float *)(lVar3 + local_88 + uVar7 * 4);
          fVar11 = fVar12;
          if (fVar12 <= 0.0) {
            fVar11 = *(float *)(plVar1 + 1);
            fVar10 = expf(fVar12);
            fVar11 = (fVar10 + -1.0) * fVar11;
          }
          *(float *)(lVar5 + local_78 + uVar7 * 4) = fVar11;
          if (0.0 <= fVar12) {
            fVar11 = *(float *)(plVar1 + 1);
            fVar12 = expf(-fVar12);
            fVar12 = (fVar12 + -1.0) * fVar11;
          }
          else {
            fVar12 = -fVar12;
          }
          *(float *)(lVar5 + local_70 + uVar7 * 4) = fVar12;
          uVar7 = uVar7 + 1;
        } while (uVar9 != uVar7);
      }
      uVar6 = uVar6 + 1;
      local_70 = local_70 + uVar9 * 8;
      local_78 = local_78 + uVar9 * 8;
      local_88 = local_88 + uVar9 * 4;
    } while (uVar6 != (uVar4 & 0xffffffff));
  }
  return RT_FUNCTION_ERROR_NOERROR;
}

Assistant:

rt_function_error_t exec_celu(rt_function_t *f) {
  celu_local_context_t *c = (celu_local_context_t *)(f->local_context);
  celu_private_t *p = (celu_private_t *)(c->data);
  int i, j, s0 = 1, s1;

  for (i = c->axis; i < p->in_shape.size; ++i) {
    s0 *= p->in_shape.data[i];
  }
  s1 = p->input_size / s0;

  for (i = 0; i < s1; ++i) {
    for (j = 0; j < s0; ++j) {
      float x = *((float *)(p->input->data) + i * s0 + j);
      float *y = (float *)(p->output->data);
      *(y + i * s0 * 2 + j) = x > 0.0f ? x : c->alpha * (expf(x) - 1.0f);
      *(y + i * s0 * 2 + s0 + j) = x < 0.0f ? -x : c->alpha * (expf(-x) - 1.0f);
    }
  }
  return RT_FUNCTION_ERROR_NOERROR;
}